

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall Descriptor_Parse_combo_Test::TestBody(Descriptor_Parse_combo_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  size_type sVar3;
  reference pvVar4;
  char *in_R9;
  AssertHelper local_620;
  Message local_618;
  string local_610;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar_6;
  Message local_5d8;
  string local_5d0;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar_5;
  Message local_598;
  string local_590;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_4;
  Message local_558;
  string local_550;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_3;
  Message local_518;
  int local_50c;
  size_type local_508;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_2;
  Message local_4e8;
  string local_4e0;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_1;
  Message local_4a8;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_470;
  Message local_468;
  bool local_459;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_;
  Message local_440;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> local_438;
  AssertHelper local_420;
  Message local_418;
  string local_410;
  AssertHelper local_3f0;
  Message local_3e8;
  Script local_3e0;
  AssertHelper local_3a8;
  Message local_3a0 [2];
  Descriptor local_390;
  undefined1 local_228 [8];
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> combo_list;
  string local_208 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  allocator local_31;
  undefined1 local_30 [8];
  string descriptor;
  Descriptor_Parse_combo_Test *this_local;
  
  descriptor.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "combo(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_208,"",
             (allocator *)
             ((long)&combo_list.
                     super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&combo_list.
                     super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::vector
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)local_228);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                (&local_390,(string *)local_30,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=
                ((Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_390);
      cfd::core::Descriptor::~Descriptor(&local_390);
    }
  }
  else {
    testing::Message::Message(local_3a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x79,
               "Expected: desc = Descriptor::Parse(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    testing::Message::~Message(local_3a0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_3e0,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_3e0);
      cfd::core::Script::~Script(&local_3e0);
    }
  }
  else {
    testing::Message::Message(&local_3e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x7a,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    testing::Message::~Message(&local_3e8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_410,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_208,(string *)&local_410);
      std::__cxx11::string::~string((string *)&local_410);
    }
  }
  else {
    testing::Message::Message(&local_418);
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x7b,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    testing::Message::~Message(&local_418);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScriptAll
                (&local_438,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::operator=
                ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)local_228,
                 &local_438);
      std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector(&local_438);
    }
  }
  else {
    testing::Message::Message(&local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x7c,
               "Expected: combo_list = desc.GetLockingScriptAll() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_440);
  }
  local_459 = cfd::core::Descriptor::IsComboScript
                        ((Descriptor *)
                         &locking_script.script_stack_.
                          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_458,&local_459,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_458,
               (AssertionResult *)"desc.IsComboScript()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_470,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_470,&local_468);
    testing::internal::AssertHelper::~AssertHelper(&local_470);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4a0,"desc_str.c_str()","descriptor.c_str()",pcVar2,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  cfd::core::Script::ToString_abi_cxx11_(&local_4e0,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4c0,"locking_script.ToString().c_str()",
             "\"0 751e76e8199196d454941c45d1b3a323f1433bd6\"",pcVar2,
             "0 751e76e8199196d454941c45d1b3a323f1433bd6");
  std::__cxx11::string::~string((string *)&local_4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  local_508 = std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::size
                        ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)local_228)
  ;
  local_50c = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_500,"combo_list.size()","4",&local_508,&local_50c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_518);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  sVar3 = std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::size
                    ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)local_228);
  if (sVar3 == 4) {
    pvVar4 = std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::operator[]
                       ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)local_228,0
                       );
    cfd::core::Script::ToString_abi_cxx11_(&local_550,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_530,"combo_list[0].ToString().c_str()",
               "\"0 751e76e8199196d454941c45d1b3a323f1433bd6\"",pcVar2,
               "0 751e76e8199196d454941c45d1b3a323f1433bd6");
    std::__cxx11::string::~string((string *)&local_550);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
    if (!bVar1) {
      testing::Message::Message(&local_558);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x84,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_558);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_558);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
    pvVar4 = std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::operator[]
                       ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)local_228,1
                       );
    cfd::core::Script::ToString_abi_cxx11_(&local_590,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_570,"combo_list[1].ToString().c_str()",
               "\"OP_HASH160 bcfeb728b584253d5f3f70bcb780e9ef218a68f4 OP_EQUAL\"",pcVar2,
               "OP_HASH160 bcfeb728b584253d5f3f70bcb780e9ef218a68f4 OP_EQUAL");
    std::__cxx11::string::~string((string *)&local_590);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
    if (!bVar1) {
      testing::Message::Message(&local_598);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x86,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_598);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_598);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
    pvVar4 = std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::operator[]
                       ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)local_228,2
                       );
    cfd::core::Script::ToString_abi_cxx11_(&local_5d0,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_5b0,"combo_list[2].ToString().c_str()",
               "\"OP_DUP OP_HASH160 751e76e8199196d454941c45d1b3a323f1433bd6 OP_EQUALVERIFY OP_CHECKSIG\""
               ,pcVar2,
               "OP_DUP OP_HASH160 751e76e8199196d454941c45d1b3a323f1433bd6 OP_EQUALVERIFY OP_CHECKSIG"
              );
    std::__cxx11::string::~string((string *)&local_5d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
    if (!bVar1) {
      testing::Message::Message(&local_5d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x88,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_5d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_5d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
    pvVar4 = std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::operator[]
                       ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)local_228,3
                       );
    cfd::core::Script::ToString_abi_cxx11_(&local_610,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_5f0,"combo_list[3].ToString().c_str()",
               "\"0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798 OP_CHECKSIG\"",
               pcVar2,
               "0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798 OP_CHECKSIG");
    std::__cxx11::string::~string((string *)&local_610);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
    if (!bVar1) {
      testing::Message::Message(&local_618);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5f0);
      testing::internal::AssertHelper::AssertHelper
                (&local_620,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x8a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_620,&local_618);
      testing::internal::AssertHelper::~AssertHelper(&local_620);
      testing::Message::~Message(&local_618);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  }
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)local_228);
  std::__cxx11::string::~string(local_208);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_combo) {
  std::string descriptor = "combo(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  std::vector<Script> combo_list;

  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(combo_list = desc.GetLockingScriptAll());
  EXPECT_TRUE(desc.IsComboScript());
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "0 751e76e8199196d454941c45d1b3a323f1433bd6");
  EXPECT_EQ(combo_list.size(), 4);
  if (combo_list.size() == 4) {
    EXPECT_STREQ(combo_list[0].ToString().c_str(),
        "0 751e76e8199196d454941c45d1b3a323f1433bd6");
    EXPECT_STREQ(combo_list[1].ToString().c_str(),
        "OP_HASH160 bcfeb728b584253d5f3f70bcb780e9ef218a68f4 OP_EQUAL");
    EXPECT_STREQ(combo_list[2].ToString().c_str(),
        "OP_DUP OP_HASH160 751e76e8199196d454941c45d1b3a323f1433bd6 OP_EQUALVERIFY OP_CHECKSIG");
    EXPECT_STREQ(combo_list[3].ToString().c_str(),
        "0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798 OP_CHECKSIG");
  }
}